

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-value-types.cc
# Opt level: O0

void value_types_test(void)

{
  Token *lhs;
  float fVar1;
  bool bVar2;
  uint32_t uVar3;
  texcoord2f *ptVar4;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t tyid_01;
  float fVar5;
  texcoord2f *tex2f;
  Value value;
  float2 uv;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  token tok3;
  undefined1 local_48 [8];
  token tok2;
  token tok1;
  
  tinyusdz::Token::Token((Token *)((long)&tok2.str_.field_2 + 8),"bora");
  tinyusdz::Token::Token((Token *)local_48,"muda");
  tinyusdz::Token::Token((Token *)local_78,"bora");
  lhs = (Token *)((long)&tok2.str_.field_2 + 8);
  bVar2 = tinyusdz::operator==(lhs,lhs);
  acutest_check_(bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x13,"%s","tok1 == tok1");
  bVar2 = tinyusdz::operator!=((Token *)((long)&tok2.str_.field_2 + 8),(Token *)local_48);
  acutest_check_(bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x14,"%s","tok1 != tok2");
  bVar2 = tinyusdz::operator==((Token *)((long)&tok2.str_.field_2 + 8),(Token *)local_78);
  acutest_check_(bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x15,"%s","tok1 == tok3");
  tinyusdz::value::GetTypeName_abi_cxx11_(&local_98,(value *)0x6,tyid);
  bVar2 = std::operator==(&local_98,"token");
  acutest_check_(bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x17,"%s","value::GetTypeName(value::TYPE_ID_TOKEN) == \"token\"");
  std::__cxx11::string::~string((string *)&local_98);
  tinyusdz::value::GetTypeName_abi_cxx11_
            (&local_b8,
             (value *)&std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       ::
                       _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ::_Rb_tree_impl.e_ident_version,tyid_00);
  bVar2 = std::operator==(&local_b8,"token[]");
  acutest_check_(bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x18,"%s",
                 "value::GetTypeName(value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT) == \"token[]\""
                );
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"token",&local_d9);
  uVar3 = tinyusdz::value::GetTypeId(&local_d8);
  acutest_check_((uint)(uVar3 == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1a,"%s","value::GetTypeId(\"token\") == value::TYPE_ID_TOKEN");
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"token[]",&local_101);
  uVar3 = tinyusdz::value::GetTypeId(&local_100);
  acutest_check_((uint)(uVar3 == 0x100006),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1b,"%s",
                 "value::GetTypeId(\"token[]\") == (value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT)"
                );
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  tinyusdz::value::TryGetTypeName_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&uv,(value *)0xffffff,tyid_01);
  bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&uv);
  acutest_check_((uint)!bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1d,"%s","!value::TryGetTypeName(value::TYPE_ID_ALL)");
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&uv);
  value.v_.vtable = (vtable_type *)0x400000003f800000;
  tinyusdz::value::Value::Value<std::array<float,2ul>>
            ((Value *)&tex2f,(array<float,_2UL> *)&value.v_.vtable);
  ptVar4 = tinyusdz::value::Value::as<tinyusdz::value::texcoord2f>((Value *)&tex2f,false);
  acutest_check_((uint)(ptVar4 != (texcoord2f *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x24,"%s","tex2f != nullptr");
  if (ptVar4 != (texcoord2f *)0x0) {
    fVar1 = ptVar4->s;
    fVar5 = std::numeric_limits<float>::epsilon();
    bVar2 = tinyusdz::math::is_close(fVar1,1.0,fVar5);
    acutest_check_(bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                   ,0x26,"%s","math::is_close(tex2f->s, 1.0f)");
    fVar1 = ptVar4->t;
    fVar5 = std::numeric_limits<float>::epsilon();
    bVar2 = tinyusdz::math::is_close(fVar1,2.0,fVar5);
    acutest_check_(bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                   ,0x27,"%s","math::is_close(tex2f->t, 2.0f)");
  }
  tinyusdz::value::Value::~Value((Value *)&tex2f);
  tinyusdz::Token::~Token((Token *)local_78);
  tinyusdz::Token::~Token((Token *)local_48);
  tinyusdz::Token::~Token((Token *)((long)&tok2.str_.field_2 + 8));
  return;
}

Assistant:

void value_types_test(void) {

  value::token tok1("bora");
  value::token tok2("muda");
  value::token tok3("bora");
  TEST_CHECK(tok1 == tok1);
  TEST_CHECK(tok1 != tok2);
  TEST_CHECK(tok1 == tok3);

  TEST_CHECK(value::GetTypeName(value::TYPE_ID_TOKEN) == "token");
  TEST_CHECK(value::GetTypeName(value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT) == "token[]");

  TEST_CHECK(value::GetTypeId("token") == value::TYPE_ID_TOKEN);
  TEST_CHECK(value::GetTypeId("token[]") == (value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT));

  TEST_CHECK(!value::TryGetTypeName(value::TYPE_ID_ALL));

  // texCoord2f <-> float2 cast
  value::float2 uv{1.0f, 2.0f};
  value::Value value(uv);

  value::texcoord2f *tex2f = value.as<value::texcoord2f>();
  TEST_CHECK(tex2f != nullptr);
  if (tex2f) {
    TEST_CHECK(math::is_close(tex2f->s, 1.0f));
    TEST_CHECK(math::is_close(tex2f->t, 2.0f));
  }

}